

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<bool> *values)

{
  bool *value_00;
  bool bVar1;
  undefined4 in_EAX;
  byte *pbVar2;
  int iVar3;
  bool value;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  bVar1 = ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                    (input,(bool *)((long)&uStack_38 + 3));
  if (bVar1) {
    value_00 = (bool *)((long)&uStack_38 + 3);
    RepeatedField<bool>::Add(values,value_00);
    uStack_38 = CONCAT44(tag,(undefined4)uStack_38) & 0xffffffffff | 0x8000000000;
    for (iVar3 = values->total_size_ - values->current_size_; bVar1 = true, 0 < iVar3;
        iVar3 = iVar3 + -1) {
      if (tag < 0x80) {
        pbVar2 = input->buffer_;
        if (input->buffer_end_ <= pbVar2) {
          return true;
        }
        if (*pbVar2 != tag) {
          return true;
        }
        pbVar2 = pbVar2 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar2 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pbVar2 < 2) {
          return true;
        }
        if (uStack_38._4_4_ != *pbVar2) {
          return true;
        }
        if (tag >> 7 != (uint)pbVar2[1]) {
          return true;
        }
        pbVar2 = pbVar2 + 2;
      }
      input->buffer_ = pbVar2;
      bVar1 = ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                        (input,value_00);
      if (!bVar1) goto LAB_001ee2e9;
      RepeatedField<bool>::AddAlreadyReserved(values,value_00);
    }
  }
  else {
LAB_001ee2e9:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}